

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2cpp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  ListType LVar8;
  char *pcVar9;
  byte bVar10;
  string arg;
  string arg_chk;
  allocator<char> local_13d;
  undefined4 local_13c;
  OutputList local_138;
  long *local_110;
  ulong local_108;
  long local_100 [2];
  string local_f0;
  long *local_d0;
  ulong local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc == 3) {
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_138._17_8_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,argv[2],(allocator<char> *)&local_110);
    if ((1 < local_c8) && (*(char *)((long)local_d0 + 1) == 'p')) {
      local_138.skip_lines = true;
    }
    bVar2 = lst::OutputList::addStream(&local_138,(istream *)&std::cin);
    if (!bVar2) goto LAB_00102a7e;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,argv[2],(allocator<char> *)&local_f0);
    LVar8 = CHAR;
    if ((char)*local_110 != 'c') {
      LVar8 = (uint)((char)*local_110 != 's') * 2;
    }
    if (1 < local_108) {
      if (*(char *)((long)local_110 + 1) == 'g') {
        bVar2 = true;
      }
      else {
        if (*(char *)((long)local_110 + 1) != 'l') goto LAB_001029aa;
        bVar2 = false;
      }
      lst::OutputList::sort(&local_138,bVar2);
    }
LAB_001029aa:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,argv[1],&local_13d);
    bVar2 = lst::OutputList::validName(&local_138,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::operator<<((ostream *)&std::cerr,
                      "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n"
                     );
LAB_00102bb5:
      exit(1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,argv[1],(allocator<char> *)&local_f0);
    bVar2 = lst::OutputList::outputToFile(&local_138,(ostream *)&std::cout,&local_b0,LVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to output stream...\n",0x1b);
    }
  }
  else {
    if (argc != 5) {
      poVar5 = std::operator<<((ostream *)&std::cerr,*argv);
      poVar5 = std::operator<<(poVar5,
                               ": Requires 4 arguments file output varname type (c or s or b)\n Or requires two arguments and reads from stdin and prints to stdout\n$ "
                              );
      poVar5 = std::operator<<(poVar5,*argv);
      poVar5 = std::operator<<(poVar5," sourcefile outputfile variablename s\n$ cat sourcefile | ");
      poVar5 = std::operator<<(poVar5,*argv);
      poVar5 = std::operator<<(poVar5,
                               " varname s\nTo use greater than sorting add a g type variable:\n$ ")
      ;
      poVar5 = std::operator<<(poVar5,*argv);
      poVar5 = std::operator<<(poVar5," inputfile outputfile varname cg\n");
      poVar5 = std::operator<<(poVar5,"For less than add l to type variable like this:\n$ ");
      poVar5 = std::operator<<(poVar5,*argv);
      std::operator<<(poVar5," inputfile outputfile varname sl\n");
      goto LAB_00102bb5;
    }
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_138._17_8_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,argv[2],(allocator<char> *)&local_110);
    if ((1 < local_c8) && (*(char *)((long)local_d0 + 1) == 'p')) {
      local_138.skip_lines = true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,argv[1],(allocator<char> *)&local_110);
    bVar2 = lst::OutputList::addFile(&local_138,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error could not load list from text file: ",0x2a);
      poVar5 = std::operator<<((ostream *)&std::cerr,argv[1]);
      std::operator<<(poVar5,"\n");
      goto LAB_00102bb5;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,argv[4],(allocator<char> *)&local_f0);
    if (*argv[4] == 'b') {
      LVar8 = BINARY;
      bVar2 = true;
      bVar10 = 0;
      local_13c = 0;
    }
    else if (*argv[4] == 's') {
      local_13c = 0;
      bVar10 = 1;
      bVar2 = false;
      LVar8 = STRING;
    }
    else {
      bVar10 = 0;
      LVar8 = CHAR;
      local_13c = 1;
      bVar2 = false;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,argv[3],&local_13d);
    bVar3 = lst::OutputList::validName(&local_138,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      std::operator<<((ostream *)&std::cerr,
                      "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n"
                     );
      goto LAB_00102bb5;
    }
    if (1 < local_108) {
      cVar1 = *(char *)((long)local_110 + 1);
      if (cVar1 == 'g') {
        bVar3 = true;
LAB_0010266a:
        lst::OutputList::sort(&local_138,bVar3);
      }
      else if (cVar1 == 'p') {
        local_138.skip_lines = true;
      }
      else if (cVar1 == 'l') {
        bVar3 = false;
        goto LAB_0010266a;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,argv[2],(allocator<char> *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[3],&local_13d);
    bVar3 = lst::OutputList::outputToFile(&local_138,&local_70,&local_90,LVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sucessfully output list to: ",0x1c);
      pcVar9 = argv[2];
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a0d0);
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input: ",7);
      pcVar9 = argv[1];
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a0d0);
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Output: ",8);
      pcVar9 = argv[2];
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a0d0);
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Variables: ",0xb);
      pcVar9 = argv[3];
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a0d0);
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"_arr and ",9);
      pcVar9 = argv[3];
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a0d0);
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"_size",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      pcVar6 = "Varaible type: char array[]\n";
      if ((char)local_13c != '\0') {
        pcVar6 = "Variable type: const char *\n";
      }
      pcVar9 = "Varaible type: std::string\n";
      if (bVar10 == 0) {
        pcVar9 = pcVar6;
      }
      if ((!bVar2 && (char)local_13c == '\0') && bVar10 == 0) goto LAB_00102a63;
      lVar7 = 0x1c - (ulong)bVar10;
    }
    else {
      lVar7 = 0x17;
      pcVar9 = "Encountered an error..\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  }
LAB_00102a63:
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
LAB_00102a7e:
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138.items);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc !=3 && argc != 5) {
        std::cerr << argv[0] << ": Requires 4 arguments file output varname type (c or s or b)\n Or requires two arguments and reads from stdin and prints to stdout\n$ " << argv[0] << " sourcefile outputfile variablename s\n$ cat sourcefile | " << argv[0] << " varname s\nTo use greater than sorting add a g type variable:\n$ " << argv[0] << " inputfile outputfile varname cg\n" << "For less than add l to type variable like this:\n$ " << argv[0] << " inputfile outputfile varname sl\n";
        exit(EXIT_FAILURE);
    }
    if(argc == 5) {
        lst::OutputList str_list;
        str_list.setSkip(false);
        std::string arg_chk = argv[2];
        if(arg_chk.length()>1 && arg_chk[1] == 'p')
            str_list.setSkip(true);
        if(str_list.addFile(argv[1])) {
            lst::ListType listvar;
            std::string arg = argv[4];
            if(argv[4][0] == 'c')
                listvar = lst::ListType::CHAR;
            else if(argv[4][0] == 'b')
                listvar = lst::ListType::BINARY;
            else if(argv[4][0] == 's')
                listvar = lst::ListType::STRING;
            
            if(str_list.validName(argv[3]) == false) {
                std::cerr << "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n";
                exit(EXIT_FAILURE);
            }

            if(arg.length() > 1 && arg[1] == 'g')
                str_list.sort(true);
            else if(arg.length() > 1 && arg[1] == 'l')
                str_list.sort(false);
            else if(arg.length() > 1 && arg[1] == 'p')
                str_list.setSkip(true);
            
            if(str_list.outputToFile(argv[2],argv[3], listvar)) {
                std::cout << "Sucessfully output list to: " << argv[2] << "\n";
                std::cout << "Input: " << argv[1] << "\n";
                std::cout << "Output: " << argv[2] << "\n";
                std::cout << "Variables: " << argv[3] << "_arr and " << argv[3] << "_size"<< "\n";
                if(listvar == lst::ListType::STRING) {
                    std::cout << "Varaible type: std::string\n";
                } else if(listvar == lst::ListType::CHAR) {
                    std::cout << "Variable type: const char *\n";
                } else if(listvar == lst::ListType::BINARY) {
                    std::cout << "Varaible type: char array[]\n";
                }
            } else {
                std::cout << "Encountered an error..\n";
            }
        } else {
            std::cerr << "Error could not load list from text file: " << argv[1] << "\n";
            exit(EXIT_FAILURE);
        }
    } else if(argc == 3) {
        lst::OutputList str_list;
        str_list.setSkip(false);
        std::string arg_chk = argv[2];
        if(arg_chk.length()>1 && arg_chk[1] == 'p')
            str_list.setSkip(true);
        
        
        if(str_list.addStream(std::cin)) {
            lst::ListType listvar;
            
            std::string arg = argv[2];
            if(arg[0] == 'c')
                listvar = lst::ListType::CHAR;
            else if(arg[0] == 's')
                listvar = lst::ListType::STRING;
            else if(arg[0] == 'b')
                listvar = lst::ListType::BINARY;
            
            if(arg.length() > 1 && arg[1] == 'g')
                str_list.sort(true);
            else if(arg.length() > 1 && arg[1] == 'l')
                str_list.sort(false);
          
            
            
            if(str_list.validName(argv[1]) == false) {
                std::cerr << "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n";
                exit(EXIT_FAILURE);
            }
            
            if(str_list.outputToFile(std::cout,argv[1], listvar) == false) {
                std::cout << "Failed to output stream...\n";
            }
        }
    }
    return 0;
}